

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::csharp::ToCSharpName(string *name,FileDescriptor *file)

{
  ulong uVar1;
  string *oldsub;
  FileDescriptor *in_RDX;
  string *in_RSI;
  string *in_RDI;
  string classname;
  string result;
  FileDescriptor *in_stack_fffffffffffffed8;
  allocator *paVar2;
  undefined8 in_stack_fffffffffffffee0;
  undefined1 replace_all;
  string *in_stack_fffffffffffffee8;
  string *s;
  allocator local_f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  allocator local_c9;
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [48];
  string local_38 [32];
  FileDescriptor *local_18;
  string *local_10;
  
  replace_all = (undefined1)((ulong)in_stack_fffffffffffffee0 >> 0x38);
  s = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  GetFileNamespace_abi_cxx11_(in_stack_fffffffffffffed8);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::operator+=(local_38,'.');
  }
  std::__cxx11::string::string(local_68);
  oldsub = FileDescriptor::package_abi_cxx11_(local_18);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    in_stack_fffffffffffffee8 = FileDescriptor::package_abi_cxx11_(local_18);
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_88,(ulong)local_10);
    replace_all = (undefined1)((ulong)local_10 >> 0x38);
    std::__cxx11::string::operator=(local_68,local_88);
    std::__cxx11::string::~string(local_88);
  }
  else {
    std::__cxx11::string::operator=(local_68,local_10);
  }
  paVar2 = &local_c9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,".",paVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffff10,".Types.",&local_f1);
  StringReplace(s,oldsub,in_stack_fffffffffffffee8,(bool)replace_all);
  std::__cxx11::string::operator+=(local_38,local_a8);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff10);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  std::operator+(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

std::string ToCSharpName(const std::string& name, const FileDescriptor* file) {
  std::string result = GetFileNamespace(file);
  if (!result.empty()) {
    result += '.';
  }
  string classname;
  if (file->package().empty()) {
    classname = name;
  } else {
    // Strip the proto package from full_name since we've replaced it with
    // the C# namespace.
    classname = name.substr(file->package().size() + 1);
  }
  result += StringReplace(classname, ".", ".Types.", true);
  return "global::" + result;
}